

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O1

void __thiscall despot::LaserTag::LaserTag(LaserTag *this)

{
  istringstream iss;
  string local_1b0;
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  BaseTag::BaseTag(&this->super_BaseTag);
  *(undefined ***)&this->super_BaseTag = &PTR__LaserTag_0011f9f8;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__LaserTag_0011fb28;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__LaserTag_0011fc30;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__LaserTag_0011fc68;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__LaserTag_0011fc90;
  this->noise_sigma_ = 2.5;
  this->unit_size_ = 1.0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BaseTag::RandomMap_abi_cxx11_(&local_1b0,&this->super_BaseTag,7,0xb,8);
  std::__cxx11::istringstream::istringstream(local_190,(string *)&local_1b0,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  BaseTag::Init(&this->super_BaseTag,(istream *)local_190);
  Init(this);
  (this->super_BaseTag).robot_pos_unknown_ = false;
  std::__cxx11::istringstream::~istringstream(local_190);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

LaserTag::LaserTag() :
	BaseTag(),
	noise_sigma_(2.5),
	unit_size_(1.0) {
	istringstream iss(RandomMap(7, 11, 8));
	BaseTag::Init(iss);
	Init();
  robot_pos_unknown_ = false;
}